

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintSExpression::printDebugDelimiterLocation(PrintSExpression *this,Expression *curr,Index i)

{
  iterator iVar1;
  ostream *poVar2;
  Expression *local_30;
  Expression *curr_local;
  
  if ((this->currFunction != (Function *)0x0) && (this->debugInfo == true)) {
    local_30 = curr;
    iVar1 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->currFunction->delimiterLocations)._M_h,&local_30);
    if (iVar1.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      Colors::grey(this->o);
      poVar2 = std::operator<<(this->o,";; code offset: 0x");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
                ((ZeroInitSmallVector<unsigned_int,_1UL> *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
                        ._M_cur + 0x10),(ulong)i);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::operator<<(poVar2,'\n');
      Colors::normal(this->o);
      doIndent(this->o,this->indent);
    }
  }
  return;
}

Assistant:

void printDebugDelimiterLocation(Expression* curr, Index i) {
    if (currFunction && debugInfo) {
      auto iter = currFunction->delimiterLocations.find(curr);
      if (iter != currFunction->delimiterLocations.end()) {
        auto& locations = iter->second;
        Colors::grey(o);
        o << ";; code offset: 0x" << std::hex << locations[i] << std::dec
          << '\n';
        restoreNormalColor(o);
        doIndent(o, indent);
      }
    }
  }